

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O2

void __thiscall
btBox2dShape::getPlane(btBox2dShape *this,btVector3 *planeNormal,btVector3 *planeSupport,int i)

{
  btScalar extraout_XMM0_Da;
  btScalar extraout_XMM0_Db;
  undefined8 uVar1;
  btVector3 bVar2;
  btVector4 plane;
  undefined8 local_30;
  btScalar local_28;
  
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0x1f])(this,&local_30,(ulong)(uint)i);
  *(undefined8 *)planeNormal->m_floats = local_30;
  planeNormal->m_floats[2] = local_28;
  planeNormal->m_floats[3] = 0.0;
  bVar2 = operator-(planeNormal);
  uVar1 = bVar2.m_floats._8_8_;
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0x10])(this);
  planeSupport->m_floats[0] = extraout_XMM0_Da;
  planeSupport->m_floats[1] = extraout_XMM0_Db;
  planeSupport->m_floats[2] = (btScalar)uVar1;
  planeSupport->m_floats[3] = (btScalar)((ulong)uVar1 >> 0x20);
  return;
}

Assistant:

virtual void getPlane(btVector3& planeNormal,btVector3& planeSupport,int i ) const
	{
		//this plane might not be aligned...
		btVector4 plane ;
		getPlaneEquation(plane,i);
		planeNormal = btVector3(plane.getX(),plane.getY(),plane.getZ());
		planeSupport = localGetSupportingVertex(-planeNormal);
	}